

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_> *
__thiscall
sf::String::toUtf16_abi_cxx11_
          (basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
           *__return_storage_ptr__,String *this)

{
  Uint32 *pUVar1;
  size_type sVar2;
  back_insert_iterator<std::__cxx11::basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>_>
  output;
  Uint32 *pUVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = 0;
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  reserve(__return_storage_ptr__,(this->m_string)._M_string_length);
  sVar2 = (this->m_string)._M_string_length;
  if (0 < (long)sVar2) {
    pUVar3 = (this->m_string)._M_dataplus._M_p;
    pUVar1 = pUVar3 + sVar2;
    output.container = __return_storage_ptr__;
    do {
      output = Utf<16u>::
               encode<std::back_insert_iterator<std::__cxx11::basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>>>
                         (*pUVar3,output,0);
      pUVar3 = pUVar3 + 1;
    } while (pUVar3 < pUVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Uint16> String::toUtf16() const
{
    // Prepare the output string
    std::basic_string<Uint16> output;
    output.reserve(m_string.length());

    // Convert
    Utf32::toUtf16(m_string.begin(), m_string.end(), std::back_inserter(output));

    return output;
}